

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void free_parser(vw *all)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  long in_RDI;
  example *temp_1;
  example *temp;
  io_buf *output;
  example *in_stack_ffffffffffffffe0;
  example *in_stack_ffffffffffffffe8;
  _func_void_void_ptr *delete_label;
  
  v_array<substring>::delete_v((v_array<substring> *)in_stack_ffffffffffffffe0);
  v_array<substring>::delete_v((v_array<substring> *)in_stack_ffffffffffffffe0);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x6b8));
  if (sVar2 != 0) {
    v_array<unsigned_long>::delete_v((v_array<unsigned_long> *)in_stack_ffffffffffffffe0);
  }
  delete_label = *(_func_void_void_ptr **)(*(long *)(in_RDI + 8) + 0x210);
  if (delete_label != (_func_void_void_ptr *)0x0) {
    v_array<char>::delete_v((v_array<char> *)in_stack_ffffffffffffffe0);
    v_array<char>::delete_v((v_array<char> *)in_stack_ffffffffffffffe0);
  }
  while (bVar1 = VW::object_pool<example,_example_initializer>::empty
                           ((object_pool<example,_example_initializer> *)0x3338f5),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffe8 =
         VW::object_pool<example,_example_initializer>::get_object
                   ((object_pool<example,_example_initializer> *)all);
    VW::dealloc_example(delete_label,in_stack_ffffffffffffffe8,
                        (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  }
  while (sVar3 = VW::ptr_queue<example>::size((ptr_queue<example> *)0x333953), sVar3 != 0) {
    in_stack_ffffffffffffffe0 = VW::ptr_queue<example>::pop((ptr_queue<example> *)output);
    VW::dealloc_example(delete_label,in_stack_ffffffffffffffe8,
                        (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  }
  v_array<unsigned_long>::delete_v((v_array<unsigned_long> *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void free_parser(vw& all)
{
  all.p->words.delete_v();
  all.p->name.delete_v();

  if (all.ngram_strings.size() > 0)
    all.p->gram_mask.delete_v();

  io_buf* output = all.p->output;
  if (output != nullptr)
  {
    output->finalname.delete_v();
    output->currentname.delete_v();
  }

  while (! all.p->example_pool.empty())
    {
      example* temp = all.p->example_pool.get_object();
      VW::dealloc_example(all.p->lp.delete_label, *temp, all.delete_prediction);
    }

  while (all.p->ready_parsed_examples.size() != 0)
    {
      example* temp = all.p->ready_parsed_examples.pop();
      VW::dealloc_example(all.p->lp.delete_label, *temp, all.delete_prediction);
    }
  all.p->counts.delete_v();
}